

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O2

void __thiscall duckdb::UpdateSourceState::~UpdateSourceState(UpdateSourceState *this)

{
  ~UpdateSourceState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit UpdateSourceState(const PhysicalUpdate &op) {
		if (op.return_chunk) {
			D_ASSERT(op.sink_state);
			auto &g = op.sink_state->Cast<UpdateGlobalState>();
			g.return_collection.InitializeScan(scan_state);
		}
	}